

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.h
# Opt level: O0

int mode_offset(PREDICTION_MODE mode)

{
  PREDICTION_MODE mode_local;
  int local_4;
  
  if (mode < 0xd) {
    switch(mode) {
    case '\0':
      local_4 = 0;
      break;
    case '\x01':
      local_4 = 1;
      break;
    case '\x02':
      local_4 = 2;
      break;
    default:
      local_4 = -1;
      break;
    case '\t':
      local_4 = 3;
    }
  }
  else {
    local_4 = mode - 0xd;
  }
  return local_4;
}

Assistant:

static inline int mode_offset(const PREDICTION_MODE mode) {
  if (mode >= NEARESTMV) {
    return INTER_OFFSET(mode);
  } else {
    switch (mode) {
      case DC_PRED: return 0;
      case V_PRED: return 1;
      case H_PRED: return 2;
      case SMOOTH_PRED: return 3;
      default: assert(0); return -1;
    }
  }
}